

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_large(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  loc_conflict lVar5;
  loc lVar6;
  wchar_t wVar7;
  ulong uVar8;
  wchar_t wVar9;
  int iVar10;
  int iVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  ulong uVar15;
  wchar_t y2;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  loc_conflict local_58;
  ulong local_50;
  wchar_t local_44;
  ulong local_40;
  ulong local_38;
  
  wVar7 = c->depth;
  local_58 = centre;
  uVar2 = Rand_div(0x19);
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',L'\x19');
  if (((c->height <= local_58.y) || (c->width <= local_58.x)) &&
     (_Var1 = find_space(&local_58,L'\v',L'\x19'), !_Var1)) {
    return false;
  }
  iVar11 = local_58.x;
  uVar8 = (ulong)local_58 & 0xffffffff;
  iVar14 = local_58.y;
  uVar16 = (ulong)(uint)local_58.y;
  wVar3 = local_58.y + L'\xfffffffc';
  local_40._0_4_ = local_58.y + L'\x04';
  local_44 = local_58.x + L'\xfffffff5';
  wVar4 = local_58.x + L'\v';
  wVar12 = local_58.y + L'\xfffffffb';
  wVar13 = local_58.x + L'\xfffffff4';
  y2 = local_58.y + L'\x05';
  wVar9 = local_58.x + L'\f';
  generate_room(c,wVar12,wVar13,y2,wVar9,(uint)(wVar7 <= uVar2 + L'\x01'));
  draw_rectangle(c,wVar12,wVar13,y2,wVar9,FEAT_GRANITE,L'\f',false);
  fill_rectangle(c,wVar3,local_44,(wchar_t)local_40,wVar4,FEAT_FLOOR,L'\0');
  wVar4 = iVar14 + L'\xfffffffd';
  wVar7 = iVar11 + L'\xfffffff6';
  wVar9 = iVar14 + L'\x03';
  wVar3 = iVar11 + L'\n';
  wVar12 = L'\v';
  draw_rectangle(c,wVar4,wVar7,wVar9,wVar3,FEAT_GRANITE,L'\v',false);
  uVar2 = Rand_div(5);
  if (uVar2 < 5) {
    uVar15 = (ulong)(iVar14 - 2);
    wVar13 = iVar11 + L'\xfffffff7';
    local_50 = uVar16;
    switch(uVar2) {
    case 0:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plain");
      generate_hole(c,wVar4,wVar7,wVar9,wVar3,FEAT_CLOSED);
      vault_monsters((chunk_conflict *)c,local_58,c->depth + L'\x02',L'\x01');
      break;
    case 1:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"nested");
      generate_hole(c,wVar4,wVar7,wVar9,wVar3,FEAT_CLOSED);
      wVar7 = iVar14 + L'\xffffffff';
      draw_rectangle(c,wVar7,iVar11 + L'\xffffffff',iVar14 + L'\x01',iVar11 + L'\x01',FEAT_GRANITE,
                     L'\v',false);
      generate_hole(c,wVar7,iVar11 + L'\xffffffff',iVar14 + L'\x01',iVar11 + L'\x01',FEAT_CLOSED);
      iVar14 = iVar11 + -2;
      do {
        do {
          iVar14 = iVar14 + 1;
          lVar6 = (loc)loc(iVar14,wVar7);
          _Var1 = square_iscloseddoor((chunk_conflict *)c,lVar6);
          if (_Var1) {
            uVar2 = Rand_div(7);
            square_set_door_lock(c,lVar6,uVar2 + L'\x01');
          }
        } while (iVar14 <= iVar11);
        bVar19 = wVar7 <= (wchar_t)local_50;
        iVar14 = iVar11 + -2;
        wVar7 = wVar7 + L'\x01';
      } while (bVar19);
      wVar7 = c->depth;
      uVar2 = Rand_div(3);
      lVar5 = local_58;
      vault_monsters((chunk_conflict *)c,local_58,wVar7 + L'\x02',uVar2 + L'\x03');
      uVar2 = Rand_div(100);
      if (((int)uVar2 < 0x50) || (dun->persist == true)) {
        place_object((chunk_conflict *)c,lVar5,c->depth,false,false,'\x03',L'\0');
      }
      else {
        place_random_stairs((chunk_conflict *)c,lVar5);
      }
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar5,L'\x04',L'\n',uVar2 + L'\x03');
      break;
    case 2:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
      generate_hole(c,wVar4,wVar7,wVar9,wVar3,FEAT_CLOSED);
      wVar7 = iVar14 + L'\xffffffff';
      wVar3 = iVar14 + L'\x01';
      fill_rectangle(c,wVar7,iVar11 + L'\xffffffff',wVar3,iVar11 + L'\x01',FEAT_GRANITE,L'\v');
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        uVar2 = Rand_div(2);
        bVar19 = uVar2 == 0;
        fill_rectangle(c,wVar7,(iVar11 - (uint)bVar19) + L'\xfffffffa',wVar3,
                       (iVar11 - (uint)bVar19) + L'\xfffffffc',FEAT_GRANITE,L'\v');
        fill_rectangle(c,wVar7,iVar11 + (uint)bVar19 + L'\x04',wVar3,iVar11 + 6 + (uint)bVar19,
                       FEAT_GRANITE,L'\v');
      }
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        draw_rectangle(c,wVar7,iVar11 + L'\xfffffffb',wVar3,iVar11 + L'\x05',FEAT_GRANITE,L'\v',
                       false);
        uVar2 = Rand_div(2);
        iVar14 = (int)local_50;
        lVar5 = loc(iVar11 + -3,iVar14 + uVar2 * 2 + -1);
        place_secret_door((chunk_conflict *)c,lVar5);
        uVar2 = Rand_div(2);
        lVar5 = loc(iVar11 + 3,iVar14 + uVar2 * 2 + -1);
        place_secret_door((chunk_conflict *)c,lVar5);
        lVar5 = loc(iVar11 + -2,iVar14);
        wVar7 = c->depth;
        uVar2 = Rand_div(2);
        vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
        local_38 = (ulong)(iVar11 + 2U);
        lVar5 = loc(iVar11 + 2U,iVar14);
        wVar7 = c->depth;
        uVar2 = Rand_div(2);
        vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
        uVar2 = Rand_div(3);
        if (uVar2 == 0) {
          lVar5 = loc(iVar11 + -2,(int)local_50);
          place_object((chunk_conflict *)c,lVar5,c->depth,false,false,'\x03',L'\0');
        }
        uVar2 = Rand_div(3);
        if (uVar2 == 0) {
          lVar5 = loc((int)local_38,(int)local_50);
          place_object((chunk_conflict *)c,lVar5,c->depth,false,false,'\x03',L'\0');
        }
      }
      break;
    case 3:
      local_40 = CONCAT44(local_40._4_4_,iVar14 + L'\x02');
      local_44 = iVar11 + L'\t';
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"checkerboard");
      generate_hole(c,wVar4,wVar7,wVar9,wVar3,FEAT_CLOSED);
      uVar17 = (iVar14 + iVar11) - 0xb;
      wVar4 = local_44;
      iVar11 = (wchar_t)local_40;
      wVar9 = wVar7;
      wVar3 = wVar13;
      local_38 = uVar8;
      uVar18 = uVar17;
      do {
        do {
          iVar14 = (int)uVar15;
          if ((uVar17 & 1) != 0) {
            lVar6 = (loc)loc(wVar3,iVar14);
            square_set_feat((chunk_conflict *)c,lVar6,FEAT_GRANITE);
            generate_mark(c,lVar6.y,lVar6.x,lVar6.y,lVar6.x,L'\v');
            wVar4 = local_44;
            iVar11 = (wchar_t)local_40;
          }
          wVar9 = wVar9 + L'\x01';
          uVar17 = uVar17 + 1;
          wVar3 = wVar3 + L'\x01';
        } while (wVar9 < wVar4);
        uVar17 = uVar18 + 1;
        uVar15 = (ulong)(iVar14 + 1);
        wVar9 = wVar7;
        wVar3 = wVar13;
        uVar18 = uVar17;
      } while (iVar14 < iVar11);
      iVar11 = (int)local_38;
      iVar14 = (int)local_50;
      lVar5 = loc(iVar11 + -5,iVar14);
      wVar7 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
      lVar5 = loc(iVar11 + 5,iVar14);
      wVar7 = c->depth;
      uVar2 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
      lVar5 = loc(iVar11 + -3,iVar14);
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar5,L'\x02',L'\b',uVar2 + L'\x01');
      lVar5 = loc(iVar11 + 3,iVar14);
      uVar2 = Rand_div(3);
      vault_traps((chunk_conflict *)c,lVar5,L'\x02',L'\b',uVar2 + L'\x01');
      vault_objects((chunk_conflict *)c,local_58,c->depth,L'\x03');
      break;
    case 4:
      local_40 = uVar15;
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"compartments");
      generate_plus(c,(wchar_t)local_40,wVar13,iVar14 + L'\x02',iVar11 + L'\t',FEAT_GRANITE,wVar12);
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 0x32) {
        uVar2 = Rand_div(10);
        iVar10 = iVar11 - (uVar2 + 1);
        lVar5 = loc(iVar10,wVar4);
        place_closed_door((chunk_conflict *)c,lVar5);
        wVar3 = uVar2 + iVar11 + L'\x01';
        lVar5 = loc(wVar3,wVar4);
        place_closed_door((chunk_conflict *)c,lVar5);
        lVar5 = loc(iVar10,wVar9);
        place_closed_door((chunk_conflict *)c,lVar5);
      }
      else {
        uVar2 = Rand_div(3);
        iVar11 = uVar2 + iVar14 + 1;
        lVar5 = loc(wVar7,iVar11);
        place_closed_door((chunk_conflict *)c,lVar5);
        wVar9 = iVar14 - (uVar2 + 1);
        lVar5 = loc(wVar7,wVar9);
        place_closed_door((chunk_conflict *)c,lVar5);
        lVar5 = loc(wVar3,iVar11);
        place_closed_door((chunk_conflict *)c,lVar5);
      }
      lVar5 = loc(wVar3,wVar9);
      place_closed_door((chunk_conflict *)c,lVar5);
      wVar7 = c->depth;
      uVar2 = Rand_div(2);
      vault_objects((chunk_conflict *)c,local_58,wVar7,uVar2 + L'\x03');
      iVar10 = local_58.x;
      iVar11 = local_58.x + -4;
      lVar5 = loc(iVar11,iVar14 + 1U);
      wVar7 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
      lVar5 = loc(iVar10 + 4,iVar14 + 1U);
      wVar7 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
      iVar14 = (int)local_50 + -1;
      lVar5 = loc(iVar11,iVar14);
      wVar7 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
      lVar5 = loc(iVar10 + 4,iVar14);
      wVar7 = c->depth;
      uVar2 = Rand_div(4);
      vault_monsters((chunk_conflict *)c,lVar5,wVar7 + L'\x02',uVar2 + L'\x01');
    }
    return true;
  }
  return true;
}

Assistant:

bool build_large(struct chunk *c, struct loc centre, int rating)
{
	int y, x, y1, x1, y2, x2;
	int height = 9;
	int width = 23;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* The inner room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);

	/* Inner room variations */
	switch (randint1(5)) {
		/* An inner room */
	case 1: {
		/* Open the inner room with a door and place a monster */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "plain");
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);
		vault_monsters(c, centre, c->depth + 2, 1);
		break;
	}


		/* An inner room with a small inner room */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "nested");

		/* Open the inner room with a door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Place another inner room */
		draw_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
			centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER, false);

		/* Open the inner room with a locked door */
		generate_hole(c, centre.y - 1, centre.x - 1, centre.y + 1, centre.x + 1,
					  FEAT_CLOSED);
		for (y = centre.y - 1; y <= centre.y + 1; y++) {
			for (x = centre.x - 1; x <= centre.x + 1; x++) {
				struct loc grid = loc(x, y);
				if (square_iscloseddoor(c, grid)) {
					square_set_door_lock(c, grid, randint1(7));
				}
			}
		}

		/* Monsters to guard the treasure */
		vault_monsters(c, centre, c->depth + 2, randint1(3) + 2);

		/* Object (80%) or Stairs (20%) */
		if (randint0(100) < 80 || dun->persist) {
			place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);
		} else {
			place_random_stairs(c, centre);
		}

		/* Traps to protect the treasure */
		vault_traps(c, centre, 4, 10, 2 + randint1(3));

		break;
	}


		/* An inner room with an inner pillar or pillars */
	case 3: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "pillar");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Inner pillar */
		fill_rectangle(c, centre.y - 1, centre.x - 1, centre.y + 1,
					   centre.x + 1, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Occasionally, two more Large Inner Pillars */
		if (one_in_(2)) {
			if (one_in_(2)) {
				fill_rectangle(c, centre.y - 1, centre.x - 7, centre.y + 1,
							   centre.x - 5, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 5, centre.y + 1,
							   centre.x + 7, FEAT_GRANITE, SQUARE_WALL_INNER);
			} else {
				fill_rectangle(c, centre.y - 1, centre.x - 6, centre.y + 1,
							   centre.x - 4, FEAT_GRANITE, SQUARE_WALL_INNER);
				fill_rectangle(c, centre.y - 1, centre.x + 4, centre.y + 1,
							   centre.x + 6, FEAT_GRANITE, SQUARE_WALL_INNER);
			}
		}

		/* Occasionally, some Inner rooms */
		if (one_in_(3)) {
			/* Inner rectangle */
			draw_rectangle(c, centre.y - 1, centre.x - 5, centre.y + 1,
				centre.x + 5, FEAT_GRANITE,
				SQUARE_WALL_INNER, false);

			/* Secret doors (random top/bottom) */
			place_secret_door(c, loc(centre.x - 3,
									 centre.y - 3 + (randint1(2) * 2)));
			place_secret_door(c, loc(centre.x + 3,
									 centre.y - 3 + (randint1(2) * 2)));

			/* Monsters */
			vault_monsters(c, loc(centre.x - 2, centre.y), c->depth + 2,
						   randint1(2));
			vault_monsters(c, loc(centre.x + 2, centre.y), c->depth + 2,
						   randint1(2));

			/* Objects */
			if (one_in_(3))
				place_object(c, loc(centre.x - 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
			if (one_in_(3))
				place_object(c, loc(centre.x + 2, centre.y), c->depth, false,
							 false, ORIGIN_SPECIAL, 0);
		}

		break;
	}


		/* An inner room with a checkerboard */
	case 4: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"checkerboard");

		/* Open the inner room with a secret door */
		generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

		/* Checkerboard */
		for (y = y1; y <= y2; y++)
			for (x = x1; x <= x2; x++)
				if ((x + y) & 0x01)
					set_marked_granite(c, loc(x, y), SQUARE_WALL_INNER);

		/* Monsters just love mazes. */
		vault_monsters(c, loc(centre.x - 5, centre.y), c->depth + 2,
					   randint1(3));
		vault_monsters(c, loc(centre.x + 5, centre.y), c->depth + 2,
					   randint1(3));

		/* Traps make them entertaining. */
		vault_traps(c, loc(centre.x - 3, centre.y), 2, 8, randint1(3));
		vault_traps(c, loc(centre.x + 3, centre.y), 2, 8, randint1(3));

		/* Mazes should have some treasure too. */
		vault_objects(c, centre, c->depth, 3);

		break;
	}


		/* Four small rooms. */
	case 5: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"compartments");

		/* Inner "cross" */
		generate_plus(c, y1, x1, y2, x2, FEAT_GRANITE, SQUARE_WALL_INNER);

		/* Doors into the rooms */
		if (randint0(100) < 50) {
			int i = randint1(10);
			place_closed_door(c, loc(centre.x - i, y1 - 1));
			place_closed_door(c, loc(centre.x + i, y1 - 1));
			place_closed_door(c, loc(centre.x - i, y2 + 1));
			place_closed_door(c, loc(centre.x + i, y2 + 1));
		} else {
			int i = randint1(3);
			place_closed_door(c, loc(x1 - 1, centre.y + i));
			place_closed_door(c, loc(x1 - 1, centre.y - i));
			place_closed_door(c, loc(x2 + 1, centre.y + i));
			place_closed_door(c, loc(x2 + 1, centre.y - i));
		}

		/* Treasure, centered at the center of the cross */
		vault_objects(c, centre, c->depth, 2 + randint1(2));

		/* Gotta have some monsters */
		vault_monsters(c, loc(centre.x - 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y + 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x - 4, centre.y - 1), c->depth + 2,
					   randint1(4));
		vault_monsters(c, loc(centre.x + 4, centre.y - 1), c->depth + 2,
					   randint1(4)); 

		break;
	}
	}

	return true;
}